

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O3

void get_fixed_sizes(Am_Object *self,Am_Value_List *components,int *fixed_width,int *fixed_height)

{
  bool bVar1;
  uint uVar2;
  Am_Value *pAVar3;
  Am_Value value;
  int max_height;
  int max_width;
  Am_Value local_38;
  int local_28;
  int local_24;
  
  local_38.type = 0;
  local_38.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(self,0x99,0);
  Am_Value::operator=(&local_38,pAVar3);
  if (local_38.type == 2) {
    uVar2 = Am_Value::operator_cast_to_int(&local_38);
  }
  else {
    bVar1 = Am_Value::operator_cast_to_bool(&local_38);
    uVar2 = (uint)bVar1;
  }
  *fixed_width = uVar2;
  pAVar3 = Am_Object::Get(self,0x9a,0);
  Am_Value::operator=(&local_38,pAVar3);
  if (local_38.type == 2) {
    uVar2 = Am_Value::operator_cast_to_int(&local_38);
  }
  else {
    bVar1 = Am_Value::operator_cast_to_bool(&local_38);
    uVar2 = (uint)bVar1;
  }
  *fixed_height = uVar2;
  if ((uVar2 == 1) || (*fixed_width == 1)) {
    get_max_sizes(components,&local_24,&local_28);
    if (*fixed_width == 1) {
      *fixed_width = local_24;
    }
    if (*fixed_height == 1) {
      *fixed_height = local_28;
    }
  }
  Am_Value::~Am_Value(&local_38);
  return;
}

Assistant:

void
get_fixed_sizes(Am_Object self, Am_Value_List &components, int &fixed_width,
                int &fixed_height)
{
  Am_Value value;
  value = self.Get(Am_FIXED_WIDTH);
  // the case where CC gets a bool as an int is taken care of automatically:
  // Am_MAX_FIXED_SIZE == 1 == (int)true; Am_NOT_FIXED_SIZE == 0 == (int)false
  if (value.type == Am_INT)
    fixed_width = value;
  else
    fixed_width = (bool)value ? Am_MAX_FIXED_SIZE : Am_NOT_FIXED_SIZE;
  value = self.Get(Am_FIXED_HEIGHT);
  if (value.type == Am_INT)
    fixed_height = value;
  else
    fixed_height = (bool)value ? Am_MAX_FIXED_SIZE : Am_NOT_FIXED_SIZE;
  if ((fixed_height == Am_MAX_FIXED_SIZE) ||
      (fixed_width == Am_MAX_FIXED_SIZE)) {
    int max_width, max_height;
    get_max_sizes(components, max_width, max_height);
    if (fixed_width == Am_MAX_FIXED_SIZE)
      fixed_width = max_width;
    if (fixed_height == Am_MAX_FIXED_SIZE)
      fixed_height = max_height;
  }
}